

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_start(JUnitReporter *this,TestCaseData *in)

{
  char *pcVar1;
  long in_RSI;
  string *in_stack_ffffffffffffff58;
  JUnitTestCaseData *this_00;
  char *in_stack_ffffffffffffff68;
  allocator *paVar2;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long local_10;
  
  local_10 = in_RSI;
  String::c_str((String *)0x118a2c);
  pcVar1 = skipPathFromFilename(in_stack_ffffffffffffff68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  this_00 = *(JUnitTestCaseData **)(local_10 + 0x20);
  paVar2 = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,(char *)this_00,paVar2);
  JUnitTestCaseData::add(this_00,in_stack_ffffffffffffff58,(string *)0x118aa8);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  detail::Timer::start((Timer *)this_00);
  return;
}

Assistant:

void test_case_start(const TestCaseData& in) override {
            testCaseData.add(skipPathFromFilename(in.m_file.c_str()), in.m_name);
            timer.start();
        }